

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O1

size_t __thiscall
cappuccino::rr_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
insert_range<std::vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>>
          (rr_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *key_value_range,allow a)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  pointer key;
  size_t sVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar4);
  }
  ppVar1 = (key_value_range->
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar5 = 0;
  for (key = (key_value_range->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; key != ppVar1; key = key + 1) {
    bVar2 = rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            ::do_insert_update((rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                                *)this,&key->first,&key->second,a);
    sVar5 = sVar5 + bVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar5;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [key, value] : key_value_range)
            {
                if (do_insert_update(key, std::move(value), a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }